

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Maybe<capnp::compiler::CompilerMain::Format> __thiscall
capnp::compiler::CompilerMain::parseFormatName(CompilerMain *this,StringPtr name)

{
  int iVar1;
  size_t in_RCX;
  int *__s1;
  
  __s1 = (int *)name.content.size_;
  switch(in_RCX) {
  case 5:
    iVar1 = bcmp(__s1,"flat",in_RCX);
    if (iVar1 == 0) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 2;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    iVar1 = bcmp(__s1,"text",in_RCX);
    if (iVar1 == 0) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 5;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    if ((char)__s1[1] == '\0' && *__s1 == 0x6e6f736a) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 6;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    break;
  case 7:
    if (*(int *)((long)__s1 + 3) == 0x797261 && *__s1 == 0x616e6962) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 0;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    if (*(int *)((long)__s1 + 3) == 0x64656b && *__s1 == 0x6b636170) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 1;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    break;
  case 10:
    iVar1 = bcmp(__s1,"canonical",in_RCX);
    if (iVar1 == 0) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 4;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
    break;
  case 0xc:
    iVar1 = bcmp(__s1,"flat-packed",in_RCX);
    if (iVar1 == 0) {
      *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 1;
      *(undefined4 *)((long)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter + 4) = 3;
      return (Maybe<capnp::compiler::CompilerMain::Format>)
             (NullableValue<capnp::compiler::CompilerMain::Format>)this;
    }
  }
  *(undefined1 *)&(this->super_GlobalErrorReporter)._vptr_GlobalErrorReporter = 0;
  return (Maybe<capnp::compiler::CompilerMain::Format>)
         (NullableValue<capnp::compiler::CompilerMain::Format>)this;
}

Assistant:

kj::Maybe<Format> parseFormatName(kj::StringPtr name) {
    if (name == "binary"     ) return Format::BINARY;
    if (name == "packed"     ) return Format::PACKED;
    if (name == "flat"       ) return Format::FLAT;
    if (name == "flat-packed") return Format::FLAT_PACKED;
    if (name == "canonical"  ) return Format::CANONICAL;
    if (name == "text"       ) return Format::TEXT;
    if (name == "json"       ) return Format::JSON;

    return kj::none;
  }